

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocmat.h
# Opt level: O0

void __thiscall TPZPostProcVar::~TPZPostProcVar(TPZPostProcVar *this,void **vtt)

{
  undefined8 *in_RSI;
  TPZSavable *in_RDI;
  
  in_RDI->_vptr_TPZSavable = (_func_int **)*in_RSI;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  TPZSavable::~TPZSavable(in_RDI,(void **)(in_RSI + 1));
  return;
}

Assistant:

~TPZPostProcVar(){}